

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<char,unsigned_long>(void)

{
  char ret;
  char ret_5;
  char ret_2;
  char local_3b;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_3a;
  char local_39;
  uint64_t local_38;
  
  local_3a.m_int = '\0';
  local_38 = 0;
  local_3b = '\0';
  MultiplicationHelper<char,unsigned_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ('\0',&local_38,&local_3b);
  local_38 = 0;
  local_3b = '\0';
  MultiplicationHelper<char,unsigned_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ('\0',&local_38,&local_3b);
  local_38 = 0;
  MultiplicationHelper<char,unsigned_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ('\0',&local_38,&local_3a.m_int);
  local_38 = 0;
  MultiplicationHelper<char,unsigned_long,13>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_3a.m_int,&local_38,&local_3a.m_int);
  local_3a.m_int = '\x01';
  local_38 = local_38 & 0xffffffffffffff00;
  local_3b = '\x01';
  DivisionHelper<char,char,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_3a.m_int,&local_3b,(char *)&local_38);
  operator/(1,local_3a);
  local_38 = 1;
  local_3b = '\0';
  AdditionHelper<char,unsigned_long,14>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_3a.m_int,&local_38,&local_3b);
  if (0xfffffeff < (int)local_3a.m_int - 0x7fU) {
    local_38 = 1;
    local_3b = '\0';
    local_39 = local_3a.m_int;
    AdditionHelper<char,unsigned_long,14>::
    AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_39,&local_38,&local_3b);
    local_38 = 1;
    AdditionHelper<char,unsigned_long,14>::
    AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_3a.m_int,&local_38,&local_3a.m_int);
    local_38 = 1;
    AdditionHelper<char,unsigned_long,14>::
    AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_3a.m_int,&local_38,&local_3a.m_int);
    local_3a.m_int = '\0';
    local_3b = '\0';
    local_38 = 0;
    local_39 = '\0';
    SubtractionHelper<unsigned_long,char,15>::
    SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_38,&local_3b,&local_39);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}